

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O1

void x86_64_ploadi(dill_stream s,int type,int junk,int dest,int src,long offset)

{
  char **ppcVar1;
  void *pvVar2;
  uint rex;
  uint insn1;
  int iVar3;
  int junk_00;
  int junk_01;
  uint uVar4;
  uint uVar5;
  int insn4;
  long lVar6;
  uint uVar7;
  int in_stack_ffffffffffffffa8;
  int local_54;
  char cVar8;
  
  insn1 = (uint)ld_opcodes[type];
  pvVar2 = s->p->mach_info;
  local_54 = 0;
  iVar3 = (int)CONCAT71((uint7)(uint3)(type - 6U >> 8),1);
  lVar6 = offset;
  uVar4 = dest;
  switch((ulong)(uint)type) {
  case 0:
  case 1:
    if (3 < dest) {
      uVar4 = 0;
    }
    if (type == 1) {
      local_54 = 0;
      if (uVar4 == src) {
        uVar4 = 0;
      }
      BYTE_OUT2R(s,(uint)(7 < (int)uVar4) * 5 + 8,0x33,(uVar4 & 7) * 9 + 0xc0);
    }
    else {
      local_54 = 0;
    }
    break;
  case 3:
    uVar4 = 0;
    if (src != dest) {
      uVar4 = dest;
    }
    BYTE_OUT2R(s,(uint)(7 < (int)uVar4) * 5 + 8,0x33,(uVar4 & 7) * 9 + 0xc0);
  case 2:
    if (s->p->code_limit <= s->p->cur_ip) {
      extend_dill_stream(s);
    }
    *s->p->cur_ip = 'f';
    if (s->dill_debug != 0) {
      dump_cur_dill_insn(s);
    }
    ppcVar1 = &s->p->cur_ip;
    *ppcVar1 = *ppcVar1 + 1;
    break;
  default:
    goto switchD_001182c2_caseD_4;
  case 9:
    local_54 = 0xf3;
    goto LAB_001183bc;
  case 10:
    local_54 = 0xf2;
LAB_001183bc:
    iVar3 = 0;
switchD_001182c2_caseD_4:
  }
  insn4 = (int)lVar6;
  uVar7 = (uint)(type - 6U < 3) * 8;
  if (*(char *)((long)pvVar2 + 0x34) != '\0') {
    if (s->p->code_limit <= s->p->cur_ip) {
      extend_dill_stream(s);
    }
    *s->p->cur_ip = *(char *)((long)pvVar2 + 0x34);
    if (s->dill_debug != 0) {
      dump_cur_dill_insn(s);
    }
    ppcVar1 = &s->p->cur_ip;
    *ppcVar1 = *ppcVar1 + 1;
    *(undefined1 *)((long)pvVar2 + 0x34) = 0;
  }
  rex = uVar7 + 4 + (uint)(7 < src);
  if ((int)uVar4 < 8) {
    rex = uVar7 | 7 < src;
  }
  uVar7 = src & 7;
  uVar5 = (uint)offset;
  cVar8 = (char)iVar3;
  if ((int)uVar5 == offset && uVar7 == 4) {
    if (offset != 0) {
      if (offset + 0x7fU < 0xff) {
        if (cVar8 == '\0') {
          BYTE_OUT1R5(s,local_54,rex,0x10,(uVar4 & 7) * 8 + 0x44,uVar5 & 0xff,
                      in_stack_ffffffffffffffa8,iVar3);
        }
        else {
          BYTE_OUT4R(s,rex,insn1,(uVar4 & 7) * 8 + 0x44,uVar5 & 0xff,insn4);
        }
      }
      else if (cVar8 == '\0') {
        BYTE_OUT1R4I(s,local_54,rex,0x10,(uVar4 & 7) * 8 + 0x84,uVar5,in_stack_ffffffffffffffa8,
                     iVar3);
      }
      else {
        BYTE_OUT3IR(s,rex,insn1,(uVar4 & 7) * 8 + 0x84,uVar5,insn4);
      }
      goto LAB_0011864d;
    }
    if (cVar8 == '\0') {
      iVar3 = (uVar4 & 7) * 8 + 4;
      uVar5 = 0x24;
LAB_00118648:
      BYTE_OUT1R4(s,local_54,rex,0x10,iVar3,uVar5,in_stack_ffffffffffffffa8);
      goto LAB_0011864d;
    }
    iVar3 = (uVar4 & 7) * 8 + 4;
    uVar5 = 0x24;
  }
  else {
    if (uVar7 != 5 && offset == 0) {
      if (cVar8 == '\0') {
        BYTE_OUT1R3(s,local_54,rex,0x10,uVar7 + (uVar4 & 7) * 8,insn4);
      }
      else {
        BYTE_OUT2R(s,rex,insn1,uVar7 + (uVar4 & 7) * 8);
      }
      goto LAB_0011864d;
    }
    if (0xfe < offset + 0x7fU) {
      if ((int)uVar5 == offset) {
        if (cVar8 == '\0') {
          BYTE_OUT1R3I(s,local_54,rex,0x10,uVar7 + (uVar4 & 7) * 8 + 0x80,uVar5,
                       in_stack_ffffffffffffffa8);
        }
        else {
          BYTE_OUT2IR(s,rex,insn1,uVar7 + (uVar4 & 7) * 8 + 0x80,uVar5);
        }
      }
      else if (dest == src) {
        x86_64_arith3i(s,0,6,src,src,offset);
        x86_64_ploadi(s,type,junk_00,dest,src,0);
      }
      else {
        BYTE_OUT1LR(s,dest < 8 ^ 9,dest & 7U | 0xb8,offset);
        x86_64_pload(s,type,junk_01,dest,src,dest);
      }
      goto LAB_0011864d;
    }
    if (cVar8 == '\0') {
      iVar3 = uVar7 + (uVar4 & 7) * 8 + 0x40;
      uVar5 = uVar5 & 0xff;
      goto LAB_00118648;
    }
    iVar3 = uVar7 + (uVar4 & 7) * 8 + 0x40;
    uVar5 = uVar5 & 0xff;
  }
  BYTE_OUT3R(s,rex,insn1,iVar3,uVar5);
LAB_0011864d:
  if ((uint)type < 4) {
    (*(code *)(&DAT_0011f1ec + *(int *)(&DAT_0011f1ec + (ulong)(uint)type * 4)))();
    return;
  }
  return;
}

Assistant:

extern void
x86_64_ploadi(dill_stream s,
              int type,
              int junk,
              int dest,
              int src,
              IMM_TYPE offset)
{
    unsigned char opcode = ld_opcodes[type];
    int tmp_dest = dest;
    x86_64_mach_info smi = (x86_64_mach_info)s->p->mach_info;
    int rex = 0;
    int float_op = 0;
    if ((type == DILL_L) || (type == DILL_UL) || (type == DILL_P)) {
        rex = REX_W;
    }
    switch (type) {
    case DILL_F:
        float_op = 0xf3;
        break;
    case DILL_D:
        float_op = 0xf2;
        break;
    case DILL_C:
    case DILL_UC:
        if (dest >= ESP) {
            /* movb doesn't work for big regs, load to eax */
            tmp_dest = EAX;
        }
        if (type == DILL_UC) {
            /* clear high bytes */
            if (src == tmp_dest) {
                /* don't destroy source */
                tmp_dest = EAX;
            }
            x86_64_clear(s, tmp_dest);
        }
        break;
    case DILL_S:
    case DILL_US:
        if (type == DILL_US) {
            /* clear high bytes */
            if (src == tmp_dest) {
                /* don't destroy source */
                tmp_dest = EAX;
            }
            x86_64_clear(s, tmp_dest);
        }
        BYTE_OUT1(s, 0x66);
        break;
    case DILL_L:
    case DILL_UL:
    case DILL_P:
    /* fall through */
    default:
        break;
    }
    if (smi->pending_prefix != 0) {
        BYTE_OUT1(s, smi->pending_prefix);
        smi->pending_prefix = 0;
    }
    if (src > RDI)
        rex |= REX_B;
    if (tmp_dest > RDI)
        rex |= REX_R;
    if (((0x7 & src) == RSP) &&
        (((offset & 0xffffffff80000000) == 0) ||
         ((offset & 0xffffffff80000000) == 0xffffffff80000000))) {
        /* must use SIB because ModRM has a discontinuity */
        if (offset == 0) {
            if (float_op != 0) {
                BYTE_OUT1R4(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x0, tmp_dest, 0x4), SIB(0, 4, src));
            } else {
                BYTE_OUT3R(s, rex, opcode, ModRM(0x0, tmp_dest, 0x4),
                           SIB(0, 4, src));
            }
        } else if (((intptr_t)offset <= 127) && ((intptr_t)offset > -128)) {
            if (float_op != 0) {
                BYTE_OUT1R5(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x1, tmp_dest, src), SIB(0, ESP, 0x4),
                            offset & 0xff);
            } else {
                BYTE_OUT4R(s, rex, opcode, ModRM(0x1, tmp_dest, src),
                           SIB(0, ESP, 0x4), offset & 0xff);
            }
        } else {
            if (float_op != 0) {
                BYTE_OUT1R4I(s, float_op, rex, 0x0f, 0x10,
                             ModRM(0x2, tmp_dest, 0x4), SIB(0, 4, src),
                             (int)offset);
            } else {
                BYTE_OUT3IR(s, rex, opcode, ModRM(0x2, tmp_dest, 0x4),
                            SIB(0, 4, src), (int)offset);
            }
        }
    } else {
        if ((offset == 0) &&
            ((src & 0x7) != 5)) { /* avoid discontinuity in ModRM */
            if (float_op != 0) {
                BYTE_OUT1R3(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x0, tmp_dest, src));
            } else {
                BYTE_OUT2R(s, rex, opcode, ModRM(0x0, tmp_dest, src));
            }
        } else if (((intptr_t)offset <= 127) && ((intptr_t)offset > -128)) {
            if (float_op != 0) {
                BYTE_OUT1R4(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x1, tmp_dest, src), offset & 0xff);
            } else {
                BYTE_OUT3R(s, rex, opcode, ModRM(0x1, tmp_dest, src),
                           offset & 0xff);
            }
        } else if (((offset & 0xffffffff80000000) == 0) ||
                   ((offset & 0xffffffff80000000) == 0xffffffff80000000)) {
            if (float_op != 0) {
                BYTE_OUT1R3I(s, float_op, rex, 0x0f, 0x10,
                             ModRM(0x2, tmp_dest, src), (int)offset);
            } else {
                BYTE_OUT2IR(s, rex, opcode, ModRM(0x2, tmp_dest, src),
                            (int)offset);
            }
        } else {
            /* really big offset */
            if (dest != src) {
                /* use dest since it'll be destroyed by the load */
                x86_64_setl(s, dest, offset);
                x86_64_pload(s, type, 0, dest, src, dest);
            } else {
                /* destroy src, but since it's the same as dest, it's lost
                 * anyway */
                x86_64_arith3i(s, 0, DILL_L, src, src, offset);
                x86_64_ploadi(s, type, 0, dest, src, 0);
            }
        }
    }
    switch (type) {
    case DILL_C:
        x86_64_lshi(s, dest, tmp_dest, 56);
        x86_64_rshai(s, dest, dest, 56);
        break;
    case DILL_S:
        x86_64_lshi(s, dest, tmp_dest, 48);
        x86_64_rshai(s, dest, dest, 48);
        break;
    case DILL_UC:
    case DILL_US:
        if (dest != tmp_dest)
            x86_64_movi(s, dest, tmp_dest);
        break;
    }
}